

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Version * Catch::libraryVersion(void)

{
  undefined8 uVar1;
  uint uVar2;
  int iVar3;
  Version *in_RDI;
  
  if (libraryVersion()::version == '\0') {
    iVar3 = __cxa_guard_acquire(&libraryVersion()::version);
    if (iVar3 != 0) {
      libraryVersion::version.majorVersion = 1;
      libraryVersion::version.minorVersion = 9;
      libraryVersion::version.patchNumber = 3;
      libraryVersion::version.branchName = "";
      libraryVersion::version.buildNumber = 0;
      __cxa_guard_release(&libraryVersion()::version);
    }
  }
  uVar1 = CONCAT44(libraryVersion::version._28_4_,libraryVersion::version.buildNumber);
  in_RDI->branchName = libraryVersion::version.branchName;
  *(undefined8 *)&in_RDI->buildNumber = uVar1;
  uVar1 = CONCAT44(libraryVersion::version._12_4_,libraryVersion::version.patchNumber);
  uVar2 = libraryVersion::version.minorVersion;
  in_RDI->majorVersion = libraryVersion::version.majorVersion;
  in_RDI->minorVersion = uVar2;
  *(undefined8 *)&in_RDI->patchNumber = uVar1;
  return in_RDI;
}

Assistant:

inline Version libraryVersion() {
        static Version version( 1, 9, 3, "", 0 );
        return version;
    }